

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multithread_futures.cpp
# Opt level: O1

int main(void)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  pointer pfVar3;
  uint uVar4;
  int iVar5;
  _func_int **pp_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Result<int> *p_Var8;
  ostream *poVar9;
  __sighandler_t __handler;
  int iVar10;
  _State_baseV2 *__tmp;
  future<int> *f;
  pointer this;
  bool bVar11;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  vector<std::future<int>,_std::allocator<std::future<int>_>_> futures;
  signal<void_()> sig;
  __state_type local_108;
  long *local_f0;
  vector<std::future<int>,_std::allocator<std::future<int>_>_> local_e8;
  __basic_future<int> local_c8;
  _func_int **local_b8 [2];
  signal<void_()> local_a8;
  
  local_a8.super_signal_base._vptr_signal_base = (_func_int **)&PTR__signal_00109a40;
  local_a8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__align = 0;
  local_a8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._8_8_ = 0;
  local_a8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._16_8_ = 0;
  local_a8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  local_a8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_a8.m_slots.m_first._0_5_ = 0;
  local_a8.m_slots.m_first._5_3_ = 0;
  local_a8.m_slots.m_last._0_5_ = 0;
  local_a8.m_slots._53_8_ = 0;
  std::condition_variable::condition_variable(&local_a8.m_slots.m_delete_cv);
  pp_Var6 = (_func_int **)time((time_t *)0x0);
  local_e8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (future<int> *)0x0;
  local_e8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (future<int> *)0x0;
  local_e8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = std::thread::hardware_concurrency();
  iVar10 = (uVar4 >> 1) + (uint)(uVar4 >> 1 == 0);
  do {
    local_108.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_108.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
    p_Var7->_M_use_count = 1;
    p_Var7->_M_weak_count = 1;
    p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109a90;
    peVar1 = (element_type *)(p_Var7 + 1);
    p_Var7[2]._M_use_count = 0;
    p_Var7[1]._M_use_count = 0;
    p_Var7[1]._M_weak_count = 0;
    *(undefined8 *)((long)&p_Var7[1]._M_weak_count + 1) = 0;
    p_Var7[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var7[3]._M_use_count = 0;
    p_Var7[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00109ae0;
    p_Var8 = (_Result<int> *)operator_new(0x18);
    std::__future_base::_Result<int>::_Result(p_Var8);
    p_Var7[4]._vptr__Sp_counted_base = (_func_int **)p_Var8;
    *(signal<void_()> **)&p_Var7[4]._M_use_count = &local_a8;
    p_Var7[5]._vptr__Sp_counted_base = pp_Var6;
    local_b8[0] = (_func_int **)0x0;
    local_f0 = (long *)operator_new(0x20);
    *local_f0 = (long)&PTR___State_00109b48;
    local_f0[1] = (long)peVar1;
    local_f0[2] = (long)std::__future_base::
                        _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/multithread_futures.cpp:21:5)>_>,_int>
                        ::_M_run;
    local_f0[3] = 0;
    std::thread::_M_start_thread(local_b8,&local_f0,0);
    if (local_f0 != (long *)0x0) {
      (**(code **)(*local_f0 + 8))();
    }
    _Var2._M_pi = local_108.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (p_Var7[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
      std::terminate();
    }
    p_Var7[3]._vptr__Sp_counted_base = local_b8[0];
    bVar11 = local_108.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_108.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    local_108.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var7;
    if (bVar11) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
    }
    if (local_108.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
      p_Var7->_M_use_count = 1;
      p_Var7->_M_weak_count = 1;
      p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109b88;
      p_Var7[2]._M_use_count = 0;
      p_Var7[1]._M_use_count = 0;
      p_Var7[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var7[1]._M_weak_count + 1) = 0;
      p_Var7[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00109bd8;
      p_Var8 = (_Result<int> *)operator_new(0x18);
      std::__future_base::_Result<int>::_Result(p_Var8);
      _Var2._M_pi = local_108.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      p_Var7[3]._vptr__Sp_counted_base = (_func_int **)p_Var8;
      *(signal<void_()> **)&p_Var7[3]._M_use_count = &local_a8;
      p_Var7[4]._vptr__Sp_counted_base = pp_Var6;
      bVar11 = local_108.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_108.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)(p_Var7 + 1);
      local_108.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var7;
      if (bVar11) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
      }
    }
    std::__basic_future<int>::__basic_future(&local_c8,&local_108);
    if (local_108.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::vector<std::future<int>,std::allocator<std::future<int>>>::emplace_back<std::future<int>>
              ((vector<std::future<int>,std::allocator<std::future<int>>> *)&local_e8,
               (future<int> *)&local_c8);
    if (local_c8._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pfVar3 = local_e8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  iVar10 = 0;
  for (this = local_e8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>.
              _M_impl.super__Vector_impl_data._M_start; this != pfVar3; this = this + 1) {
    iVar5 = std::future<int>::get(this);
    iVar10 = iVar10 + iVar5;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Count = ",8);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
  iVar10 = 0x106029;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  std::vector<std::future<int>,_std::allocator<std::future<int>_>_>::~vector(&local_e8);
  obs::signal<void_()>::~signal(&local_a8,iVar10,__handler);
  return 0;
}

Assistant:

int main() {
  obs::signal<void()> sig;
  std::time_t t = std::time(nullptr);

  auto func =
    [&sig, t](){
      int count = 0;
      while ((std::time(nullptr) - t) < 5) {
        std::vector<obs::scoped_connection> conns(32);
        for (auto& conn : conns) {
          conn = sig.connect([](){ });
          ++count;
          if (std::time(nullptr) - t >= 5)
            break;
        }
      }
      return count;
    };

  std::vector<std::future<int>> futures;
  int n = std::max<int>(1, std::thread::hardware_concurrency()/2);
  while (n--)
    futures.emplace_back(std::async(std::launch::async, func));

  int count = 0;
  for (auto& f : futures)
    count += f.get();

  std::cout << "Count = " << count << "\n";
  return 0;
}